

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O2

error_t ArgumentHandlers::perseus_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = state->input;
  if (key == 0x49) {
    *(undefined4 *)((long)pvVar1 + 0xf4) = 1;
  }
  else if (key == 0x50) {
    *(undefined4 *)((long)pvVar1 + 0xe8) = 1;
  }
  else if (key == 0x56) {
    *(undefined4 *)((long)pvVar1 + 0xec) = 1;
  }
  else if (key == 0x69) {
    iVar2 = atoi(arg);
    *(int *)((long)pvVar1 + 0xf0) = iVar2;
  }
  else if (key == 0x6d) {
    *(undefined1 *)((long)pvVar1 + 0x222) = 1;
    iVar2 = atoi(arg);
    *(long *)((long)pvVar1 + 0x228) = (long)iVar2;
  }
  else if (key == 0x7a) {
    *(undefined4 *)((long)pvVar1 + 0xf8) = 1;
  }
  else if (key == 0x74) {
    *(undefined4 *)((long)pvVar1 + 0xac) = 1;
  }
  else {
    if (key != 0x6e) {
      return 7;
    }
    iVar2 = atoi(arg);
    *(int *)((long)pvVar1 + 0x100) = iVar2;
  }
  return 0;
}

Assistant:

error_t
perseus_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case 'n':
        theArgumentsStruc->nrBeliefs = atoi(arg);
        break;
    case 'P':
        theArgumentsStruc->savePOMDP=1;
        break;
    case 'V':
        theArgumentsStruc->saveIntermediateV=1;
        break;
    case 't':
        theArgumentsStruc->saveTimings = 1;
        break;
    case 'i':
        theArgumentsStruc->minimumNrIterations = atoi(arg);
        break;
    case 'I':
        theArgumentsStruc->initializeWithImmediateReward=1;
        break;
    case 'z':
        theArgumentsStruc->initializeWithZero=1;
        break;
    case 'm':
        theArgumentsStruc->marginalize = true;
        theArgumentsStruc->marginalizationIndex = atoi(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}